

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

int thread_main(void *data)

{
  double dVar1;
  float fVar2;
  
  glfwMakeContextCurrent(*data);
  glfwSwapInterval(1);
  while (running != 0) {
    dVar1 = glfwGetTime();
    dVar1 = sin(dVar1 + dVar1);
    fVar2 = ABS((float)dVar1);
    (*glad_glClearColor)
              (*(float *)((long)data + 0x10) * fVar2,*(float *)((long)data + 0x14) * fVar2,
               fVar2 * *(float *)((long)data + 0x18),0.0);
    (*glad_glClear)(0x4000);
    glfwSwapBuffers(*data);
  }
  glfwMakeContextCurrent((GLFWwindow *)0x0);
  return 0;
}

Assistant:

static int thread_main(void* data)
{
    const Thread* thread = data;

    glfwMakeContextCurrent(thread->window);
    glfwSwapInterval(1);

    while (running)
    {
        const float v = (float) fabs(sin(glfwGetTime() * 2.f));
        glClearColor(thread->r * v, thread->g * v, thread->b * v, 0.f);

        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(thread->window);
    }

    glfwMakeContextCurrent(NULL);
    return 0;
}